

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::on_replacement_field
          (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
           *this,char *p)

{
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char> *this_00;
  iterator it;
  long in_RDI;
  basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_stack_00000020;
  arg_formatter<fmt::v6::buffer_range<char>_> *in_stack_00000028;
  char *in_stack_ffffffffffffffb8;
  basic_format_parse_context<char,_fmt::v6::internal::error_handler> *in_stack_ffffffffffffffc0;
  format_specs *in_stack_ffffffffffffffc8;
  basic_format_parse_context<char,_fmt::v6::internal::error_handler> *in_stack_ffffffffffffffd0;
  context_type *in_stack_ffffffffffffffd8;
  arg_formatter<fmt::v6::buffer_range<char>_> *in_stack_ffffffffffffffe0;
  
  advance_to<char,fmt::v6::internal::error_handler>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = (basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
             *)(in_RDI + 0x20);
  arg_formatter<fmt::v6::buffer_range<char>_>::arg_formatter
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  it = visit_format_arg<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                 (in_stack_00000028,in_stack_00000020);
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::
  advance_to(this_00,(iterator)it.container);
  return;
}

Assistant:

void on_replacement_field(const Char* p) {
    advance_to(parse_context, p);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context), arg));
  }